

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::
GetFreeObjectListOnAllocatorImpl<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **freeObjectList)

{
  HeapBucket *pHVar1;
  
  pHVar1 = this->heapBucket + 1;
  while (*(SmallHeapBlockT<MediumAllocationBlockAttributes> **)&pHVar1->newHeapBlockCount != this) {
    pHVar1 = (HeapBucket *)pHVar1[1].heapInfo;
    if (pHVar1 == this->heapBucket + 1) {
      return false;
    }
  }
  if (*(SmallHeapBlockT<MediumAllocationBlockAttributes> **)&pHVar1->newHeapBlockCount ==
      (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    return false;
  }
  if (pHVar1->heapInfo != (HeapInfo *)0x0) {
    return false;
  }
  *freeObjectList = *(FreeObject **)&pHVar1->sizeCat;
  return true;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::GetFreeObjectListOnAllocatorImpl(FreeObject ** freeObjectList)
{
    // not during collection, the allocator has the current info
    SmallHeapBlockAllocator<TBlockType> * head =
        &((HeapBucketT<TBlockType> *)this->heapBucket)->allocatorHead;
    SmallHeapBlockAllocator<TBlockType> * current = head;
    do
    {
        if (current->GetHeapBlock() == this)
        {
            if (current->IsFreeListAllocMode())
            {
                *freeObjectList = current->freeObjectList;
                return true;
            }
            return false;
        }
        current = current->GetNext();
    }
    while (current != head);
    return false;
}